

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

bool embree::avx512::
     BVHNIntersectorKHybrid<8,_4,_1,_false,_embree::avx512::ArrayIntersectorK_1<4,_embree::avx512::TriangleMIntersectorKMoeller<4,_4,_false>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_false> *tray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  float fVar3;
  int iVar4;
  undefined4 uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong *puVar23;
  ulong *puVar24;
  ulong uVar25;
  ulong uVar26;
  long lVar27;
  ulong unaff_R15;
  size_t mask;
  bool bVar28;
  bool bVar29;
  byte bVar30;
  byte bVar31;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  uint local_1204;
  size_t local_11d8;
  ulong local_11d0 [564];
  
  local_11d8 = root.ptr;
  fVar1 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  auVar49._4_4_ = fVar1;
  auVar49._0_4_ = fVar1;
  auVar49._8_4_ = fVar1;
  auVar49._12_4_ = fVar1;
  auVar49._16_4_ = fVar1;
  auVar49._20_4_ = fVar1;
  auVar49._24_4_ = fVar1;
  auVar49._28_4_ = fVar1;
  fVar2 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  auVar50._4_4_ = fVar2;
  auVar50._0_4_ = fVar2;
  auVar50._8_4_ = fVar2;
  auVar50._12_4_ = fVar2;
  auVar50._16_4_ = fVar2;
  auVar50._20_4_ = fVar2;
  auVar50._24_4_ = fVar2;
  auVar50._28_4_ = fVar2;
  fVar3 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  auVar51._4_4_ = fVar3;
  auVar51._0_4_ = fVar3;
  auVar51._8_4_ = fVar3;
  auVar51._12_4_ = fVar3;
  auVar51._16_4_ = fVar3;
  auVar51._20_4_ = fVar3;
  auVar51._24_4_ = fVar3;
  auVar51._28_4_ = fVar3;
  fVar1 = fVar1 * *(float *)((long)&(tray->org).field_0 + k * 4);
  fVar2 = fVar2 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  fVar3 = fVar3 * *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  uVar18 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar21 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar22 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  auVar52._0_8_ = CONCAT44(fVar1,fVar1) ^ 0x8000000080000000;
  auVar52._8_4_ = -fVar1;
  auVar52._12_4_ = -fVar1;
  auVar52._16_4_ = -fVar1;
  auVar52._20_4_ = -fVar1;
  auVar52._24_4_ = -fVar1;
  auVar52._28_4_ = -fVar1;
  auVar53._0_8_ = CONCAT44(fVar2,fVar2) ^ 0x8000000080000000;
  auVar53._8_4_ = -fVar2;
  auVar53._12_4_ = -fVar2;
  auVar53._16_4_ = -fVar2;
  auVar53._20_4_ = -fVar2;
  auVar53._24_4_ = -fVar2;
  auVar53._28_4_ = -fVar2;
  iVar4 = (tray->tnear).field_0.i[k];
  auVar54._4_4_ = iVar4;
  auVar54._0_4_ = iVar4;
  auVar54._8_4_ = iVar4;
  auVar54._12_4_ = iVar4;
  auVar54._16_4_ = iVar4;
  auVar54._20_4_ = iVar4;
  auVar54._24_4_ = iVar4;
  auVar54._28_4_ = iVar4;
  auVar55._0_8_ = CONCAT44(fVar3,fVar3) ^ 0x8000000080000000;
  auVar55._8_4_ = -fVar3;
  auVar55._12_4_ = -fVar3;
  auVar55._16_4_ = -fVar3;
  auVar55._20_4_ = -fVar3;
  auVar55._24_4_ = -fVar3;
  auVar55._28_4_ = -fVar3;
  iVar4 = (tray->tfar).field_0.i[k];
  auVar56._4_4_ = iVar4;
  auVar56._0_4_ = iVar4;
  auVar56._8_4_ = iVar4;
  auVar56._12_4_ = iVar4;
  auVar56._16_4_ = iVar4;
  auVar56._20_4_ = iVar4;
  auVar56._24_4_ = iVar4;
  auVar56._28_4_ = iVar4;
  local_1204 = (uint)tray;
  puVar24 = local_11d0;
  do {
    puVar23 = puVar24;
    if (puVar23 == &local_11d8) break;
    puVar24 = puVar23 + -1;
    uVar26 = puVar23[-1];
    do {
      if ((uVar26 & 8) == 0) {
        auVar32 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar26 + 0x40 + uVar18),auVar52,auVar49);
        auVar57 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar26 + 0x40 + uVar21),auVar53,auVar50);
        auVar8 = vpmaxsd_avx2(ZEXT1632(auVar32),ZEXT1632(auVar57));
        auVar32 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar26 + 0x40 + uVar22),auVar55,auVar51);
        auVar9 = vpmaxsd_avx2(ZEXT1632(auVar32),auVar54);
        auVar8 = vpmaxsd_avx2(auVar8,auVar9);
        auVar32 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar26 + 0x40 + (uVar18 ^ 0x20)),auVar52,
                                  auVar49);
        auVar57 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar26 + 0x40 + (uVar21 ^ 0x20)),auVar53,
                                  auVar50);
        auVar9 = vpminsd_avx2(ZEXT1632(auVar32),ZEXT1632(auVar57));
        auVar32 = vfmadd132ps_fma(*(undefined1 (*) [32])(uVar26 + 0x40 + (uVar22 ^ 0x20)),auVar55,
                                  auVar51);
        auVar10 = vpminsd_avx2(ZEXT1632(auVar32),auVar56);
        auVar9 = vpminsd_avx2(auVar9,auVar10);
        uVar14 = vpcmpd_avx512vl(auVar8,auVar9,2);
        unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),(uint)(byte)uVar14);
      }
      if ((uVar26 & 8) == 0) {
        if (unaff_R15 == 0) {
          uVar19 = 4;
        }
        else {
          uVar25 = uVar26 & 0xfffffffffffffff0;
          lVar27 = 0;
          for (uVar26 = unaff_R15; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
            lVar27 = lVar27 + 1;
          }
          uVar19 = 0;
          uVar17 = unaff_R15 - 1 & unaff_R15;
          uVar26 = *(ulong *)(uVar25 + lVar27 * 8);
          if (uVar17 != 0) {
            *puVar24 = uVar26;
            while( true ) {
              puVar24 = puVar24 + 1;
              lVar27 = 0;
              for (uVar26 = uVar17; (uVar26 & 1) == 0; uVar26 = uVar26 >> 1 | 0x8000000000000000) {
                lVar27 = lVar27 + 1;
              }
              uVar17 = uVar17 - 1 & uVar17;
              uVar26 = *(ulong *)(uVar25 + lVar27 * 8);
              if (uVar17 == 0) break;
              *puVar24 = uVar26;
            }
          }
        }
      }
      else {
        uVar19 = 6;
      }
    } while (uVar19 == 0);
    if (uVar19 == 6) {
      uVar25 = (ulong)((uint)uVar26 & 0xf);
      uVar17 = uVar25 - 8;
      bVar28 = uVar25 != 8;
      if (bVar28) {
        uVar5 = *(undefined4 *)(ray + k * 4);
        auVar57._4_4_ = uVar5;
        auVar57._0_4_ = uVar5;
        auVar57._8_4_ = uVar5;
        auVar57._12_4_ = uVar5;
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x10);
        auVar58._4_4_ = uVar5;
        auVar58._0_4_ = uVar5;
        auVar58._8_4_ = uVar5;
        auVar58._12_4_ = uVar5;
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x20);
        auVar59._4_4_ = uVar5;
        auVar59._0_4_ = uVar5;
        auVar59._8_4_ = uVar5;
        auVar59._12_4_ = uVar5;
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x40);
        auVar60._4_4_ = uVar5;
        auVar60._0_4_ = uVar5;
        auVar60._8_4_ = uVar5;
        auVar60._12_4_ = uVar5;
        uVar26 = uVar26 & 0xfffffffffffffff0;
        uVar5 = *(undefined4 *)(ray + k * 4 + 0x50);
        auVar61._4_4_ = uVar5;
        auVar61._0_4_ = uVar5;
        auVar61._8_4_ = uVar5;
        auVar61._12_4_ = uVar5;
        auVar32 = vbroadcastss_avx512vl(ZEXT416(*(uint *)(ray + k * 4 + 0x60)));
        uVar25 = 0;
        do {
          lVar27 = uVar25 * 0xb0;
          auVar46 = *(undefined1 (*) [16])(uVar26 + 0x80 + lVar27);
          auVar48 = *(undefined1 (*) [16])(uVar26 + 0x40 + lVar27);
          auVar47 = *(undefined1 (*) [16])(uVar26 + 0x70 + lVar27);
          auVar6 = *(undefined1 (*) [16])(uVar26 + 0x50 + lVar27);
          auVar33 = vmulps_avx512vl(auVar48,auVar46);
          auVar34 = vfmsub231ps_avx512vl(auVar33,auVar47,auVar6);
          auVar33 = *(undefined1 (*) [16])(uVar26 + 0x60 + lVar27);
          auVar35 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar26 + lVar27),auVar57);
          auVar36 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar26 + 0x10 + lVar27),auVar58);
          auVar7 = *(undefined1 (*) [16])(uVar26 + 0x30 + lVar27);
          auVar37 = vsubps_avx512vl(*(undefined1 (*) [16])(uVar26 + 0x20 + lVar27),auVar59);
          auVar38 = vmulps_avx512vl(auVar6,auVar33);
          auVar39 = vfmsub231ps_avx512vl(auVar38,auVar46,auVar7);
          auVar38 = vmulps_avx512vl(auVar7,auVar47);
          auVar40 = vfmsub231ps_avx512vl(auVar38,auVar33,auVar48);
          auVar38 = vmulps_avx512vl(auVar61,auVar37);
          auVar41 = vfmsub231ps_avx512vl(auVar38,auVar36,auVar32);
          auVar38 = vmulps_avx512vl(auVar32,auVar35);
          auVar42 = vfmsub231ps_avx512vl(auVar38,auVar37,auVar60);
          auVar38 = vmulps_avx512vl(auVar60,auVar36);
          auVar43 = vfmsub231ps_avx512vl(auVar38,auVar35,auVar61);
          auVar38 = vmulps_avx512vl(auVar40,auVar32);
          auVar38 = vfmadd231ps_avx512vl(auVar38,auVar39,auVar61);
          auVar44 = vfmadd231ps_avx512vl(auVar38,auVar34,auVar60);
          auVar38._8_4_ = 0x7fffffff;
          auVar38._0_8_ = 0x7fffffff7fffffff;
          auVar38._12_4_ = 0x7fffffff;
          auVar38 = vandps_avx512vl(auVar44,auVar38);
          auVar45._8_4_ = 0x80000000;
          auVar45._0_8_ = 0x8000000080000000;
          auVar45._12_4_ = 0x80000000;
          auVar45 = vandps_avx512vl(auVar44,auVar45);
          auVar46 = vmulps_avx512vl(auVar46,auVar43);
          auVar46 = vfmadd231ps_avx512vl(auVar46,auVar42,auVar47);
          auVar46 = vfmadd231ps_avx512vl(auVar46,auVar41,auVar33);
          auVar46 = vxorps_avx512vl(auVar45,auVar46);
          auVar47 = vmulps_avx512vl(auVar6,auVar43);
          auVar48 = vfmadd231ps_avx512vl(auVar47,auVar48,auVar42);
          auVar48 = vfmadd231ps_avx512vl(auVar48,auVar7,auVar41);
          auVar48 = vxorps_avx512vl(auVar45,auVar48);
          auVar47 = ZEXT816(0) << 0x20;
          uVar14 = vcmpps_avx512vl(auVar46,auVar47,5);
          uVar11 = vcmpps_avx512vl(auVar48,auVar47,5);
          uVar12 = vcmpps_avx512vl(auVar44,auVar47,4);
          auVar46 = vaddps_avx512vl(auVar46,auVar48);
          uVar13 = vcmpps_avx512vl(auVar46,auVar38,2);
          bVar30 = (byte)uVar14 & (byte)uVar11 & (byte)uVar12 & (byte)uVar13;
          if (bVar30 == 0) {
            bVar29 = false;
          }
          else {
            auVar46 = vmulps_avx512vl(auVar40,auVar37);
            auVar46 = vfmadd213ps_avx512vl(auVar36,auVar39,auVar46);
            auVar46 = vfmadd213ps_avx512vl(auVar35,auVar34,auVar46);
            auVar47 = vxorps_avx512vl(auVar45,auVar46);
            uVar5 = *(undefined4 *)(ray + k * 4 + 0x30);
            auVar46._4_4_ = uVar5;
            auVar46._0_4_ = uVar5;
            auVar46._8_4_ = uVar5;
            auVar46._12_4_ = uVar5;
            auVar46 = vmulps_avx512vl(auVar38,auVar46);
            uVar5 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar48._4_4_ = uVar5;
            auVar48._0_4_ = uVar5;
            auVar48._8_4_ = uVar5;
            auVar48._12_4_ = uVar5;
            auVar48 = vmulps_avx512vl(auVar38,auVar48);
            uVar14 = vcmpps_avx512vl(auVar47,auVar48,2);
            uVar11 = vcmpps_avx512vl(auVar46,auVar47,1);
            bVar31 = (byte)uVar14 & (byte)uVar11;
            bVar29 = (bVar31 & bVar30) != 0;
            if (bVar29) {
              local_1204 = (uint)(bVar31 & bVar30);
            }
          }
          if (bVar29) {
            uVar20 = (ulong)(byte)local_1204;
            do {
              uVar15 = 0;
              for (uVar16 = uVar20; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000) {
                uVar15 = uVar15 + 1;
              }
              if ((((context->scene->geometries).items
                    [*(uint *)(lVar27 + uVar26 + 0x90 + uVar15 * 4)].ptr)->mask &
                  *(uint *)(ray + k * 4 + 0x90)) != 0) goto LAB_00831c7a;
              uVar20 = uVar20 ^ 1L << (uVar15 & 0x3f);
            } while (uVar20 != 0);
          }
          uVar25 = uVar25 + 1;
          bVar28 = uVar25 < uVar17;
        } while (uVar25 != uVar17);
      }
LAB_00831c7a:
      uVar19 = 0;
      if (bVar28) {
        *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
        uVar19 = 1;
      }
    }
  } while ((uVar19 & 3) == 0);
  return puVar23 != &local_11d8;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }